

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_bpf_uninit(ma_bpf *pBPF,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bpf2 *pmVar1;
  ulong uVar2;
  long lVar3;
  
  if (pBPF != (ma_bpf *)0x0) {
    if (pBPF->bpf2Count != 0) {
      lVar3 = 0x38;
      uVar2 = 0;
      do {
        pmVar1 = pBPF->pBPF2;
        if ((pmVar1 != (ma_bpf2 *)0x0) && (*(int *)((long)&(pmVar1->bq).format + lVar3) != 0)) {
          ma_free(*(void **)((long)pmVar1 + lVar3 + -8),pAllocationCallbacks);
        }
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar2 < pBPF->bpf2Count);
    }
    if (pBPF->_ownsHeap != 0) {
      ma_free(pBPF->_pHeap,pAllocationCallbacks);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_bpf_uninit(ma_bpf* pBPF, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_uint32 ibpf2;

    if (pBPF == NULL) {
        return;
    }

    for (ibpf2 = 0; ibpf2 < pBPF->bpf2Count; ibpf2 += 1) {
        ma_bpf2_uninit(&pBPF->pBPF2[ibpf2], pAllocationCallbacks);
    }

    if (pBPF->_ownsHeap) {
        ma_free(pBPF->_pHeap, pAllocationCallbacks);
    }
}